

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall expr_struct_of_struct_Test::TestBody(expr_struct_of_struct_Test *this)

{
  __node_base_ptr *this_00;
  Generator *pGVar1;
  PackedSlice *pPVar2;
  char *message;
  long lVar3;
  initializer_list<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>
  __l;
  undefined1 local_7a0 [8];
  Generator mod;
  Context c;
  PackedStruct struct1;
  PackedStructFieldDef local_b8;
  Generator *local_88;
  shared_ptr<kratos::VarPackedStruct> var_;
  shared_ptr<kratos::PackedStruct> struct2;
  AssertionResult gtest_ar;
  undefined1 local_48 [8];
  string str;
  AssertHelper local_20;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&struct1.external,"data1",(allocator<char> *)&local_b8);
  local_7a0[0] = false;
  local_7a0._4_4_ = 1;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[7]>
            ((_Head_base<0ul,std::__cxx11::string,false> *)&mod,(char (*) [7])0x229980);
  mod.super_IRNode.verilog_ln._0_1_ = 0;
  mod.super_IRNode._36_4_ = 2;
  std::_Head_base<0ul,std::__cxx11::string,false>::_Head_base<char_const(&)[7]>
            ((_Head_base<0ul,std::__cxx11::string,false> *)&mod.super_IRNode.comment,
             (char (*) [7])0x2296fb);
  __l._M_len = 2;
  __l._M_array = (iterator)local_7a0;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
            *)&mod.use_stmts_remove_cache_,__l,(allocator_type *)local_48);
  this_00 = &c.tracked_generators_._M_h._M_single_bucket;
  kratos::PackedStruct::PackedStruct
            ((PackedStruct *)this_00,(string *)&struct1.external,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
              *)&mod.use_stmts_remove_cache_);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
             *)&mod.use_stmts_remove_cache_);
  lVar3 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_7a0 + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&struct1.external);
  std::make_shared<kratos::PackedStruct,char_const(&)[6]>
            ((char (*) [6])
             &var_.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_b8.name._M_dataplus._M_p = (pointer)&local_b8.name.field_2;
  local_b8.width = 0;
  local_b8.signed_ = false;
  local_b8._37_3_ = 0;
  local_b8.struct_ = (PackedStruct *)0x0;
  local_b8.name.field_2._M_allocated_capacity = 0;
  local_b8.name.field_2._8_8_ = 0;
  local_b8.name._M_string_length = 0;
  std::__cxx11::string::assign((char *)&local_b8);
  local_b8.struct_ = (PackedStruct *)this_00;
  std::vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>>::
  emplace_back<kratos::PackedStructFieldDef&>
            ((vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>> *)
             (var_.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi + 2),&local_b8);
  kratos::Context::Context((Context *)&mod.use_stmts_remove_cache_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"mod",
             (allocator<char> *)
             &struct2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pGVar1 = kratos::Context::generator((Context *)&mod.use_stmts_remove_cache_,(string *)local_48);
  kratos::Generator::Generator((Generator *)local_7a0,pGVar1);
  std::__cxx11::string::~string((string *)local_48);
  local_48 = (undefined1  [8])local_7a0;
  std::
  make_shared<kratos::VarPackedStruct,kratos::Generator*,char_const(&)[3],std::shared_ptr<kratos::PackedStruct>&>
            (&local_88,(char (*) [3])local_48,(shared_ptr<kratos::PackedStruct> *)0x238e0a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,"value",(allocator<char> *)(str.field_2._M_local_buf + 8));
  pPVar2 = kratos::VarPackedStruct::operator[]((VarPackedStruct *)local_88,(string *)local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &struct2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"value1",(allocator<char> *)&local_20);
  pPVar2 = kratos::VarSlice::operator[]
                     (&pPVar2->super_VarSlice,
                      (string *)
                      &struct2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::__cxx11::string::~string
            ((string *)
             &struct2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_48);
  (*(pPVar2->super_VarSlice).super_Var.super_IRNode._vptr_IRNode[0x1f])(local_48,pPVar2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[16]>
            ((internal *)
             &struct2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"str","\"in.value.value1\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [16])"in.value.value1");
  if ((char)struct2.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi == '\0') {
    testing::Message::Message((Message *)((long)&str.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0xd2,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)((long)&str.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (str.field_2._8_8_ != 0) {
      (**(code **)(*(long *)str.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::__cxx11::string::~string((string *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_);
  kratos::Generator::~Generator((Generator *)local_7a0);
  kratos::Context::~Context((Context *)&mod.use_stmts_remove_cache_);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&struct2);
  kratos::PackedStruct::~PackedStruct((PackedStruct *)&c.tracked_generators_._M_h._M_single_bucket);
  return;
}

Assistant:

TEST(expr, struct_of_struct) {  // NOLINT
    auto struct1 = PackedStruct("data1", {{"value1", 1, false}, {"value2", 2, false}});
    auto struct2 = std::make_shared<PackedStruct>("data2");
    auto attr = PackedStructFieldDef();
    attr.name = "value";
    attr.struct_ = &struct1;
    struct2->attributes.emplace_back(attr);

    Context c;
    auto mod = c.generator("mod");

    auto var_ = std::make_shared<VarPackedStruct>(&mod, "in", struct2);
    auto &var = *var_;

    auto &slice = var["value"]["value1"];
    auto str = slice.to_string();
    EXPECT_EQ(str, "in.value.value1");
}